

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5StorageContentInsert(Fts5Storage *p,sqlite3_value **apVal,i64 *piRowid)

{
  uint uVar1;
  Fts5Config *pFVar2;
  Mem *pMem;
  sqlite3_stmt *psVar3;
  int iVar4;
  i64 iVar5;
  long lVar6;
  sqlite3_stmt *pInsert;
  
  pFVar2 = p->pConfig;
  if (pFVar2->eContent != 0) {
    pMem = apVal[1];
    uVar1._0_2_ = pMem->flags;
    uVar1._2_1_ = pMem->enc;
    uVar1._3_1_ = pMem->eSubtype;
    if ((0x50505050U >> (uVar1 & 0x1f) & 1) == 0) {
      if (pFVar2->bColumnsize == 0) {
        return 0x14;
      }
      pInsert = (sqlite3_stmt *)0x0;
      iVar4 = fts5StorageGetStmt(p,6,&pInsert,(char **)0x0);
      psVar3 = pInsert;
      if (iVar4 != 0) {
        return iVar4;
      }
      sqlite3_bind_null(pInsert,1);
      sqlite3_bind_null(psVar3,2);
      sqlite3_step(psVar3);
      iVar4 = sqlite3_reset(psVar3);
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar5 = p->pConfig->db->lastRowid;
    }
    else {
      iVar5 = sqlite3VdbeIntValue(pMem);
    }
    *piRowid = iVar5;
    return 0;
  }
  pInsert = (sqlite3_stmt *)0x0;
  iVar4 = fts5StorageGetStmt(p,3,&pInsert,(char **)0x0);
  psVar3 = pInsert;
  lVar6 = 1;
  do {
    if (iVar4 != 0) {
LAB_00195538:
      *piRowid = pFVar2->db->lastRowid;
      return iVar4;
    }
    if ((long)pFVar2->nCol + 1 < lVar6) {
      sqlite3_step(psVar3);
      iVar4 = sqlite3_reset(psVar3);
      goto LAB_00195538;
    }
    iVar4 = sqlite3_bind_value(psVar3,(int)lVar6,apVal[lVar6]);
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

static int sqlite3Fts5StorageContentInsert(
  Fts5Storage *p, 
  sqlite3_value **apVal, 
  i64 *piRowid
){
  Fts5Config *pConfig = p->pConfig;
  int rc = SQLITE_OK;

  /* Insert the new row into the %_content table. */
  if( pConfig->eContent!=FTS5_CONTENT_NORMAL ){
    if( sqlite3_value_type(apVal[1])==SQLITE_INTEGER ){
      *piRowid = sqlite3_value_int64(apVal[1]);
    }else{
      rc = fts5StorageNewRowid(p, piRowid);
    }
  }else{
    sqlite3_stmt *pInsert = 0;    /* Statement to write %_content table */
    int i;                        /* Counter variable */
    rc = fts5StorageGetStmt(p, FTS5_STMT_INSERT_CONTENT, &pInsert, 0);
    for(i=1; rc==SQLITE_OK && i<=pConfig->nCol+1; i++){
      rc = sqlite3_bind_value(pInsert, i, apVal[i]);
    }
    if( rc==SQLITE_OK ){
      sqlite3_step(pInsert);
      rc = sqlite3_reset(pInsert);
    }
    *piRowid = sqlite3_last_insert_rowid(pConfig->db);
  }

  return rc;
}